

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)

{
  void *pvVar1;
  int iVar2;
  bnode *pbVar3;
  size_t __n;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t v;
  timeval __test_begin;
  char local_51;
  btree_kv_ops *local_50;
  char local_48 [8];
  timeval local_40;
  
  local_50 = kv_ops;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar3 = (bnode *)malloc(0x1010);
  pbVar3->kvsize = 0;
  pbVar3->flag = 0;
  pbVar3->level = 0;
  pbVar3->nentry = 0;
  (pbVar3->field_4).data = (void *)0x0;
  pbVar3->kvsize = 0x801;
  pbVar3->level = 1;
  pbVar3->nentry = 10;
  (pbVar3->field_4).data = pbVar3 + 1;
  local_51 = 'd';
  uVar6 = 0;
  lVar4 = 0;
  do {
    sprintf(local_48,"key%d",uVar6);
    (*local_50->set_kv)(pbVar3,(idx_t)uVar6,local_48,&local_51);
    pvVar1 = (pbVar3->field_4).data;
    __n = strlen(local_48);
    iVar2 = bcmp((void *)((long)pvVar1 + lVar4),local_48,__n);
    if (iVar2 != 0) {
      kv_set_var_nentry_test();
    }
    if (*(char *)((pbVar3->field_4).dummy + 8 + lVar4) != local_51) {
      kv_set_var_nentry_test();
    }
    local_51 = local_51 + '\x01';
    lVar4 = lVar4 + 9;
    uVar5 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar5;
  } while (uVar5 != 10);
  kv_set_var_nentry_test();
  return;
}

Assistant:

void kv_set_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char *key = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    for (idx = 0; idx < n; idx ++){

        // set key/value
        sprintf(key, "key%d", idx);
        kv_ops->set_kv(node, idx, key, (void *)&v);

        // verify
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key, strlen(key)));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

        // update value
        v++;

    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_test");
}